

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::dtime_t,duckdb::interval_t,duckdb::dtime_t,duckdb::BinaryStandardOperatorWrapper,duckdb::SubtractTimeOperator,bool,false,true>
               (dtime_t *ldata,interval_t *rdata,dtime_t *result_data,idx_t count,ValidityMask *mask
               ,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  dtime_t left;
  dtime_t left_00;
  dtime_t dVar3;
  ulong uVar4;
  dtime_t *pdVar5;
  dtime_t *pdVar6;
  idx_t iVar7;
  idx_t i;
  ulong uVar8;
  idx_t iVar9;
  ulong uVar10;
  ulong uVar11;
  interval_t right;
  interval_t right_00;
  interval_t right_01;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    iVar7 = count;
    for (iVar9 = 0; count != iVar9; iVar9 = iVar9 + 1) {
      dVar3.micros._0_4_ = rdata->months;
      dVar3.micros._4_4_ = rdata->days;
      right_01.micros = iVar7;
      right_01._0_8_ = rdata->micros;
      dVar3 = SubtractTimeOperator::Operation<duckdb::dtime_t,duckdb::interval_t,duckdb::dtime_t>
                        ((SubtractTimeOperator *)ldata[iVar9].micros,dVar3,right_01);
      result_data[iVar9].micros = dVar3.micros;
    }
  }
  else {
    uVar10 = 0;
    for (pdVar5 = (dtime_t *)0x0; pdVar5 != (dtime_t *)(count + 0x3f >> 6);
        pdVar5 = (dtime_t *)((long)&pdVar5->micros + 1)) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      pdVar6 = pdVar5;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar8 = uVar10 + 0x40;
        if (count <= uVar10 + 0x40) {
          uVar8 = count;
        }
LAB_01810a69:
        for (; uVar4 = uVar10, uVar10 < uVar8; uVar10 = uVar10 + 1) {
          left.micros._0_4_ = rdata->months;
          left.micros._4_4_ = rdata->days;
          right.micros = (int64_t)pdVar6;
          right._0_8_ = rdata->micros;
          dVar3 = SubtractTimeOperator::
                  Operation<duckdb::dtime_t,duckdb::interval_t,duckdb::dtime_t>
                            ((SubtractTimeOperator *)ldata[uVar10].micros,left,right);
          result_data[uVar10].micros = dVar3.micros;
        }
      }
      else {
        uVar2 = puVar1[(long)pdVar5];
        uVar8 = uVar10 + 0x40;
        if (count <= uVar10 + 0x40) {
          uVar8 = count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_01810a69;
        uVar4 = uVar8;
        if (uVar2 != 0) {
          for (uVar11 = 0; uVar4 = uVar11 + uVar10, uVar11 + uVar10 < uVar8; uVar11 = uVar11 + 1) {
            if ((uVar2 >> (uVar11 & 0x3f) & 1) != 0) {
              left_00.micros._0_4_ = rdata->months;
              left_00.micros._4_4_ = rdata->days;
              right_00.micros = (int64_t)pdVar6;
              right_00._0_8_ = rdata->micros;
              dVar3 = SubtractTimeOperator::
                      Operation<duckdb::dtime_t,duckdb::interval_t,duckdb::dtime_t>
                                ((SubtractTimeOperator *)ldata[uVar10 + uVar11].micros,left_00,
                                 right_00);
              (result_data + uVar10)[uVar11].micros = dVar3.micros;
              pdVar6 = result_data + uVar10;
            }
          }
        }
      }
      uVar10 = uVar4;
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}